

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O0

int secp256k1_fe_equal(secp256k1_fe *a,secp256k1_fe *b)

{
  int iVar1;
  secp256k1_fe *in_RSI;
  secp256k1_fe *in_RDI;
  secp256k1_fe na;
  secp256k1_fe sStack_38;
  secp256k1_fe *local_10;
  secp256k1_fe *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  secp256k1_fe_verify(in_RDI);
  secp256k1_fe_verify(local_10);
  secp256k1_fe_verify_magnitude(local_8,1);
  secp256k1_fe_verify_magnitude(local_10,0x1f);
  secp256k1_fe_impl_negate_unchecked(&sStack_38,local_8,1);
  secp256k1_fe_impl_add(&sStack_38,local_10);
  iVar1 = secp256k1_fe_impl_normalizes_to_zero(&sStack_38);
  return iVar1;
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_equal(const secp256k1_fe *a, const secp256k1_fe *b) {
    secp256k1_fe na;
    SECP256K1_FE_VERIFY(a);
    SECP256K1_FE_VERIFY(b);
    SECP256K1_FE_VERIFY_MAGNITUDE(a, 1);
    SECP256K1_FE_VERIFY_MAGNITUDE(b, 31);

    secp256k1_fe_negate(&na, a, 1);
    secp256k1_fe_add(&na, b);
    return secp256k1_fe_normalizes_to_zero(&na);
}